

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::sext(APInt *this,uint Width)

{
  uint uVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t *puVar4;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  APInt *this_00;
  APInt *__src;
  int iVar6;
  APInt AVar7;
  
  this_00 = (APInt *)CONCAT44(in_register_00000034,Width);
  if (this_00->BitWidth < in_EDX) {
    if (in_EDX < 0x41) {
      uVar3 = SignExtend64((this_00->U).VAL,this_00->BitWidth);
      APInt(this,in_EDX,uVar3,false);
      uVar5 = extraout_RDX;
    }
    else {
      puVar4 = getMemory((uint)((ulong)in_EDX + 0x3f >> 6));
      this->BitWidth = in_EDX;
      (this->U).pVal = puVar4;
      uVar1 = this_00->BitWidth;
      __src = this_00;
      if (0x40 < (ulong)uVar1) {
        __src = (APInt *)(this_00->U).pVal;
      }
      iVar6 = (int)((ulong)uVar1 + 0x3f >> 6);
      memcpy(puVar4,__src,(ulong)(uint)(iVar6 * 8));
      uVar3 = SignExtend64(puVar4[iVar6 - 1],(uVar1 - 1 & 0x3f) + 1);
      iVar6 = (int)((ulong)this_00->BitWidth + 0x3f >> 6);
      (this->U).pVal[iVar6 - 1] = uVar3;
      puVar4 = (this->U).pVal;
      bVar2 = isNegative(this_00);
      memset((void *)((ulong)(uint)(iVar6 << 3) + (long)puVar4),-(uint)bVar2,
             (ulong)(uint)(((int)((ulong)this->BitWidth + 0x3f >> 6) -
                           (int)((ulong)this_00->BitWidth + 0x3f >> 6)) * 8));
      clearUnusedBits(this);
      uVar5 = extraout_RDX_00;
    }
    AVar7._8_8_ = uVar5;
    AVar7.U.pVal = (uint64_t *)this;
    return AVar7;
  }
  __assert_fail("Width > BitWidth && \"Invalid APInt SignExtend request\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x349,"APInt llvm::APInt::sext(unsigned int) const");
}

Assistant:

APInt APInt::sext(unsigned Width) const {
  assert(Width > BitWidth && "Invalid APInt SignExtend request");

  if (Width <= APINT_BITS_PER_WORD)
    return APInt(Width, SignExtend64(U.VAL, BitWidth));

  APInt Result(getMemory(getNumWords(Width)), Width);

  // Copy words.
  std::memcpy(Result.U.pVal, getRawData(), getNumWords() * APINT_WORD_SIZE);

  // Sign extend the last word since there may be unused bits in the input.
  Result.U.pVal[getNumWords() - 1] =
      SignExtend64(Result.U.pVal[getNumWords() - 1],
                   ((BitWidth - 1) % APINT_BITS_PER_WORD) + 1);

  // Fill with sign bits.
  std::memset(Result.U.pVal + getNumWords(), isNegative() ? -1 : 0,
              (Result.getNumWords() - getNumWords()) * APINT_WORD_SIZE);
  Result.clearUnusedBits();
  return Result;
}